

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O1

int VP8GetInfo(uint8_t *data,size_t data_size,size_t chunk_size,int *width,int *height)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = 0;
  if (((((9 < data_size && data != (uint8_t *)0x0) && (data[3] == 0x9d)) && (data[4] == '\x01')) &&
      ((data[5] == '*' && ((*data & 0x19) == 0x10)))) &&
     ((((uint)data[2] << 0x10 | (uint)data[1] << 8 | (uint)*data) >> 5 < chunk_size &&
      ((uVar2 = (data[7] & 0x3f) << 8 | (uint)data[6], uVar2 != 0 &&
       (uVar3 = (data[9] & 0x3f) << 8 | (uint)data[8], uVar3 != 0)))))) {
    if (width != (int *)0x0) {
      *width = uVar2;
    }
    iVar1 = 1;
    if (height != (int *)0x0) {
      *height = uVar3;
    }
  }
  return iVar1;
}

Assistant:

int VP8GetInfo(const uint8_t* data, size_t data_size, size_t chunk_size,
               int* const width, int* const height) {
  if (data == NULL || data_size < VP8_FRAME_HEADER_SIZE) {
    return 0;         // not enough data
  }
  // check signature
  if (!VP8CheckSignature(data + 3, data_size - 3)) {
    return 0;         // Wrong signature.
  } else {
    const uint32_t bits = data[0] | (data[1] << 8) | (data[2] << 16);
    const int key_frame = !(bits & 1);
    const int w = ((data[7] << 8) | data[6]) & 0x3fff;
    const int h = ((data[9] << 8) | data[8]) & 0x3fff;

    if (!key_frame) {   // Not a keyframe.
      return 0;
    }

    if (((bits >> 1) & 7) > 3) {
      return 0;         // unknown profile
    }
    if (!((bits >> 4) & 1)) {
      return 0;         // first frame is invisible!
    }
    if (((bits >> 5)) >= chunk_size) {  // partition_length
      return 0;         // inconsistent size information.
    }
    if (w == 0 || h == 0) {
      return 0;         // We don't support both width and height to be zero.
    }

    if (width) {
      *width = w;
    }
    if (height) {
      *height = h;
    }

    return 1;
  }
}